

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

void avro::parsing::testWriterFail<avro::parsing::ValidatingCodecFactory>(TestData2 *td)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  parsing *this;
  shared_count *this_00;
  auto_ptr<avro::OutputStream> p;
  assertion_result local_2a0;
  ValidSchema vs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  const_string local_260 [4];
  const_string local_220;
  const_string local_210;
  const_string local_200;
  const_string local_1f0;
  const_string local_1e0;
  const_string local_1d0;
  undefined1 local_1c0 [8];
  shared_count local_1b8;
  undefined8 *local_1b0;
  char *local_1a8;
  
  testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo =
       testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo + 1;
  local_260[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_260[0].m_end = "";
  memset((basic_wrap_stringstream<char> *)local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_1c0);
  std::operator<<((ostream *)local_1c0,"Test: ");
  pbVar1 = boost::operator<<((basic_wrap_stringstream<char> *)local_1c0,
                             &testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo);
  std::operator<<((ostream *)pbVar1,' ');
  std::operator<<((ostream *)pbVar1," schema: ");
  pbVar1 = boost::operator<<(pbVar1,&td->schema);
  std::operator<<((ostream *)pbVar1," incorrectCalls: ");
  pbVar1 = boost::operator<<(pbVar1,&td->incorrectCalls);
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar1);
  local_1d0.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_1d0.m_end = local_1d0.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar1,local_260,0x2e9,&local_1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_1c0);
  this = (parsing *)&vs;
  makeValidSchema(this,td->schema);
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p._M_ptr = (OutputStream *)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_1e0.m_end = "";
  local_1f0.m_begin = "";
  local_1f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_1e0,0x2ef,&local_1f0);
  ValidatingEncoderFactory::newEncoder((ValidatingEncoderFactory *)local_1c0,&vs);
  testEncoder((EncoderPtr *)local_1c0,td->incorrectCalls,&v,&p);
  this_00 = &local_1b8;
  boost::detail::shared_count::~shared_count(this_00);
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_200.m_end = "";
  local_210.m_begin = "";
  local_210.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_200,0x2ef,&local_210);
  local_2a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_2a0.m_message.px = (element_type *)0x0;
  local_2a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8.pi_._0_1_ = false;
  local_1c0 = (undefined1  [8])&PTR__lazy_ostream_001edb38;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = "exception Exception expected but not raised";
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_220.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,(lazy_ostream *)local_1c0,&local_220,0x2ef,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_2a0.m_message.pn);
  if (p._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)p._M_ptr + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  boost::detail::shared_count::~shared_count(&vs.root_.pn);
  return;
}

Assistant:

void testWriterFail(const TestData2& td) {
    static int testNo = 0;
    testNo++;
    BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
        << " schema: " << td.schema
        << " incorrectCalls: " << td.incorrectCalls);
    ValidSchema vs = makeValidSchema(td.schema);

    vector<string> v;
    auto_ptr<OutputStream> p;
    BOOST_CHECK_THROW(testEncoder(CodecFactory::newEncoder(vs),
        td.incorrectCalls, v, p), Exception);
}